

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O0

vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> * __thiscall
dg::vr::VRLocation::getSuccLocations(VRLocation *this)

{
  bool bVar1;
  vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> *in_RSI;
  vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> *in_RDI;
  unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_> *edge;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
  *__range2;
  vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> *result;
  vector<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
  *in_stack_ffffffffffffffa8;
  vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> *__x;
  __normal_iterator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_*,_std::vector<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>_>
  local_28;
  vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  std::vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>::vector
            ((vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> *)0x1bfdef);
  local_20 = in_RSI + 0xb;
  local_28._M_current =
       (unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_> *)
       std::
       vector<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  std::
  vector<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
  ::end(in_stack_ffffffffffffffa8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_*,_std::vector<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>_>
                             *)in_RDI,
                            (__normal_iterator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_*,_std::vector<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>_>
                             *)in_stack_ffffffffffffffa8), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_*,_std::vector<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>_>
    ::operator*(&local_28);
    std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>::operator->
              ((unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_> *)0x1bfe4b);
    std::vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>::push_back
              (in_RSI,(value_type *)__x);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_*,_std::vector<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>_>
    ::operator++(&local_28);
  }
  return __x;
}

Assistant:

std::vector<VRLocation *> VRLocation::getSuccLocations() {
    std::vector<VRLocation *> result;
    for (auto &edge : successors) {
        result.push_back(edge->target);
    }
    return result;
}